

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.c++
# Opt level: O0

Value * __thiscall
kj::_::Debug::Context::ensureInitialized(Value *__return_storage_ptr__,Context *this)

{
  int iVar1;
  char *pcVar2;
  String local_90;
  Value local_78;
  undefined1 local_4d;
  String local_40;
  Value *local_28;
  Value *v;
  Value *_v444;
  Context *this_local;
  Value *result;
  
  _v444 = (Value *)this;
  this_local = (Context *)__return_storage_ptr__;
  local_28 = readMaybe<kj::_::Debug::Context::Value>(&this->value);
  v = local_28;
  if (local_28 == (Value *)0x0) {
    local_4d = 0;
    (*(this->super_ExceptionCallback)._vptr_ExceptionCallback[7])(__return_storage_ptr__);
    pcVar2 = __return_storage_ptr__->file;
    iVar1 = __return_storage_ptr__->line;
    heapString(&local_90,&__return_storage_ptr__->description);
    Value::Value(&local_78,pcVar2,iVar1,&local_90);
    Maybe<kj::_::Debug::Context::Value>::operator=(&this->value,&local_78);
    Value::~Value(&local_78);
    String::~String(&local_90);
  }
  else {
    pcVar2 = local_28->file;
    iVar1 = local_28->line;
    heapString(&local_40,&local_28->description);
    Value::Value(__return_storage_ptr__,pcVar2,iVar1,&local_40);
    String::~String(&local_40);
  }
  return __return_storage_ptr__;
}

Assistant:

Debug::Context::Value Debug::Context::ensureInitialized() {
  KJ_IF_SOME(v, value) {
    return Value(v.file, v.line, heapString(v.description));
  } else {
    Value result = evaluate();
    value = Value(result.file, result.line, heapString(result.description));
    return result;
  }